

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O0

void UnitTests::stream_any_details::output_unsigned<unsigned_long>
               (ostream *s,unsigned_long *t,int width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  void *this;
  int width_local;
  unsigned_long *t_local;
  ostream *s_local;
  
  poVar3 = std::operator<<(s,"0x");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  _Var2 = std::setw(width);
  poVar3 = std::operator<<(poVar3,_Var2);
  uVar4 = std::ostream::operator<<(poVar3,std::internal);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  this = (void *)std::ostream::operator<<(poVar3,*t);
  std::ostream::operator<<(this,std::dec);
  return;
}

Assistant:

void output_unsigned(std::ostream& s, const T& t, int width)
        {
            s << "0x" << std::hex << std::setw(width) << std::internal << std::setfill('0') << t << std::dec;
        }